

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O0

event_queue_t * __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
::bind_agent(dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
             *this,agent_ref_t *agent,bind_params_t *params)

{
  bool bVar1;
  intrusive_ptr_t<so_5::agent_t> local_58;
  undefined4 local_4c;
  intrusive_ptr_t<so_5::agent_t> local_48 [3];
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  bind_params_t *params_local;
  agent_ref_t *agent_local;
  dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
  *this_local;
  
  lock._M_device = (mutex_type *)params;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->m_lock);
  bVar1 = adv_thread_pool::impl::adaptation_t::is_individual_fifo((params_t *)lock._M_device);
  if (bVar1) {
    intrusive_ptr_t<so_5::agent_t>::intrusive_ptr_t(local_48,agent);
    this_local = (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
                  *)bind_agent_with_inidividual_fifo(this,local_48,(bind_params_t *)lock._M_device);
    intrusive_ptr_t<so_5::agent_t>::~intrusive_ptr_t(local_48);
  }
  else {
    intrusive_ptr_t<so_5::agent_t>::intrusive_ptr_t(&local_58,agent);
    this_local = (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
                  *)bind_agent_with_cooperation_fifo(this,&local_58,(bind_params_t *)lock._M_device)
    ;
    intrusive_ptr_t<so_5::agent_t>::~intrusive_ptr_t(&local_58);
  }
  local_4c = 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return (event_queue_t *)this_local;
}

Assistant:

virtual event_queue_t *
		bind_agent( agent_ref_t agent, const PARAMS & params ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				if( ADAPTATIONS::is_individual_fifo( params ) )
					return bind_agent_with_inidividual_fifo(
							std::move( agent ), params );

				return bind_agent_with_cooperation_fifo(
						std::move( agent ), params );
			}